

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::BinaryExpr<const_hta::Clock::time_point_&,_const_hta::Clock::time_point_&>::
streamReconstructedExpression
          (BinaryExpr<const_hta::Clock::time_point_&,_const_hta::Clock::time_point_&> *this,
          ostream *os)

{
  string *lhs;
  char *pcVar1;
  string *in_R9;
  StringRef op;
  long *local_68 [2];
  long local_58 [2];
  long *local_48 [2];
  long local_38 [2];
  
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_48,Detail::unprintableString_abi_cxx11_,
             DAT_001aaeb0 + Detail::unprintableString_abi_cxx11_);
  lhs = (string *)(this->m_op).m_start;
  pcVar1 = (char *)(this->m_op).m_size;
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_68,Detail::unprintableString_abi_cxx11_,
             DAT_001aaeb0 + Detail::unprintableString_abi_cxx11_);
  op.m_size = (size_type)local_68;
  op.m_start = pcVar1;
  formatReconstructedExpression((Catch *)os,(ostream *)local_48,lhs,op,in_R9);
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            formatReconstructedExpression
                    ( os, Catch::Detail::stringify( m_lhs ), m_op, Catch::Detail::stringify( m_rhs ) );
        }